

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.cpp
# Opt level: O0

istream * amrex::operator>>(istream *is,IndexType *it)

{
  istream *piVar1;
  ulong uVar2;
  uint *in_RSI;
  istream *in_RDI;
  char t2;
  char t1;
  char t0;
  char local_93;
  char local_92;
  char local_91;
  uint *local_90;
  istream *local_88;
  
  local_90 = in_RSI;
  local_88 = in_RDI;
  piVar1 = (istream *)std::istream::ignore((long)in_RDI,100000);
  std::operator>>(piVar1,&local_91);
  piVar1 = (istream *)std::istream::ignore((long)local_88,100000);
  std::operator>>(piVar1,&local_92);
  piVar1 = (istream *)std::istream::ignore((long)local_88,100000);
  std::operator>>(piVar1,&local_93);
  std::istream::ignore((long)local_88,100000);
  if (local_91 == 'N') {
    *local_90 = *local_90 | 1;
  }
  else {
    *local_90 = *local_90 & 0xfffffffe;
  }
  if (local_92 == 'N') {
    *local_90 = *local_90 | 2;
  }
  else {
    *local_90 = *local_90 & 0xfffffffd;
  }
  if (local_93 == 'N') {
    *local_90 = *local_90 | 4;
  }
  else {
    *local_90 = *local_90 & 0xfffffffb;
  }
  uVar2 = std::ios::fail();
  if ((uVar2 & 1) != 0) {
    Error_host("operator>>(ostream&,IndexType&) failed");
  }
  return local_88;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            IndexType&    it)
{
    char AMREX_D_DECL(t0,t1,t2);

    AMREX_D_EXPR( is.ignore(BL_IGNORE_MAX, '(') >> t0,
            is.ignore(BL_IGNORE_MAX, ',') >> t1,
            is.ignore(BL_IGNORE_MAX, ',') >> t2);
    is.ignore(BL_IGNORE_MAX, ')');
    AMREX_D_TERM(
        BL_ASSERT(t0 == 'C' || t0 == 'N'); t0=='N'?it.set(0):it.unset(0); ,
        BL_ASSERT(t1 == 'C' || t1 == 'N'); t1=='N'?it.set(1):it.unset(1); ,
        BL_ASSERT(t2 == 'C' || t2 == 'N'); t2=='N'?it.set(2):it.unset(2));

    if (is.fail())
        amrex::Error("operator>>(ostream&,IndexType&) failed");

    return is;
}